

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQClosure::Release(SQClosure *this)

{
  SQFunctionProto *pSVar1;
  SQTable *pSVar2;
  SQObjectPtr *in_RDI;
  SQInteger nl_1;
  SQInteger nl;
  SQInteger size;
  SQFunctionProto *f;
  SQUnsignedInteger in_stack_ffffffffffffffc8;
  long local_28;
  long local_20;
  
  pSVar1 = in_RDI[4].super_SQObject._unVal.pFunctionProto;
  for (local_20 = 0; local_20 < pSVar1->_noutervalues; local_20 = local_20 + 1) {
    ::SQObjectPtr::~SQObjectPtr(in_RDI);
  }
  for (local_28 = 0; local_28 < pSVar1->_ndefaultparams; local_28 = local_28 + 1) {
    ::SQObjectPtr::~SQObjectPtr(in_RDI);
  }
  if (in_RDI[4].super_SQObject._unVal.pTable != (SQTable *)0x0) {
    pSVar2 = in_RDI[4].super_SQObject._unVal.pTable;
    (pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef =
         (pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef - 1;
    if (((in_RDI[4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
        super_SQRefCounted._uiRef == 0) {
      (*((in_RDI[4].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
        super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    in_RDI[4].super_SQObject._unVal.pTable = (SQTable *)0x0;
  }
  (*(code *)**(undefined8 **)&in_RDI->super_SQObject)();
  sq_vm_free(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void Release(){
        SQFunctionProto *f = _function;
        SQInteger size = _CALC_CLOSURE_SIZE(f);
        _DESTRUCT_VECTOR(SQObjectPtr,f->_noutervalues,_outervalues);
        _DESTRUCT_VECTOR(SQObjectPtr,f->_ndefaultparams,_defaultparams);
        __ObjRelease(_function);
        this->~SQClosure();
        sq_vm_free(this,size);
    }